

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O1

void __thiscall DiskTable::~DiskTable(DiskTable *this)

{
  ofstream clock_os;
  path local_260;
  path local_238;
  undefined1 local_210 [248];
  ios_base local_118 [264];
  
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_260,(char (*) [13])"sstable.lock",auto_format);
  std::filesystem::__cxx11::operator/(&local_238,&this->db_home,&local_260);
  create_binary_ofstream((path *)local_210);
  std::filesystem::__cxx11::path::~path(&local_238);
  std::filesystem::__cxx11::path::~path(&local_260);
  std::ostream::write(local_210,(long)&this->SSTableClock);
  local_210._0_8_ = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18)) = __M_split_cmpts;
  std::filebuf::~filebuf((filebuf *)(local_210 + 8));
  std::ios_base::~ios_base(local_118);
  std::filesystem::__cxx11::path::~path(&this->db_home);
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::~vector(&this->diskView);
  return;
}

Assistant:

DiskTable::~DiskTable() {
    auto clock_os = create_binary_ofstream(db_home / "sstable.lock");
    bytes_write(clock_os, &SSTableClock); // Sync SSTableClock to disk when exit.
}